

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandLineArgument.h
# Opt level: O2

bool __thiscall
cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
::matches(cmCommandLineArgument<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmake_*)>
          *this,string *input)

{
  char cVar1;
  RequiresSeparator RVar2;
  size_type sVar3;
  bool bVar4;
  __type _Var5;
  bool bVar6;
  string_view str;
  string_view prefix;
  
  if (this->Type != Zero) {
    RVar2 = this->SeparatorNeeded;
    str._M_str = (input->_M_dataplus)._M_p;
    str._M_len = input->_M_string_length;
    prefix._M_str = (this->Name)._M_dataplus._M_p;
    prefix._M_len = (this->Name)._M_string_length;
    bVar4 = cmHasPrefix(str,prefix);
    bVar6 = RVar2 == No && bVar4;
    if ((RVar2 != No) && (bVar4)) {
      sVar3 = (this->Name)._M_string_length;
      bVar6 = true;
      if (input->_M_string_length != sVar3) {
        cVar1 = (input->_M_dataplus)._M_p[sVar3];
        bVar6 = cVar1 == ' ' || cVar1 == '=';
      }
    }
    return bVar6;
  }
  _Var5 = std::operator==(input,&this->Name);
  return _Var5;
}

Assistant:

bool matches(std::string const& input) const
  {
    bool matched = false;
    if (this->Type == Values::Zero) {
      matched = (input == this->Name);
    } else if (this->SeparatorNeeded == RequiresSeparator::No) {
      matched = cmHasPrefix(input, this->Name);
    } else if (cmHasPrefix(input, this->Name)) {
      if (input.size() == this->Name.size()) {
        matched = true;
      } else {
        matched =
          (input[this->Name.size()] == '=' || input[this->Name.size()] == ' ');
      }
    }
    return matched;
  }